

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

int lws_system_blob_get(lws_system_blob_t *b,uint8_t *buf,size_t *len,size_t ofs)

{
  uint uVar1;
  ulong uVar2;
  lws_buflist *plVar3;
  ulong uVar4;
  
  if (b->is_direct == '\0') {
    uVar1 = lws_buflist_linear_copy((lws_buflist **)b,ofs,buf,*len);
    if ((int)uVar1 < 0) {
      return -2;
    }
    *len = (ulong)uVar1;
  }
  else {
    plVar3 = (b->u).bl;
    if (plVar3 == (lws_buflist *)0x0) {
      __assert_fail("b->u.direct.ptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/system/system.c"
                    ,0x53,
                    "int lws_system_blob_get(lws_system_blob_t *, uint8_t *, size_t *, size_t)");
    }
    uVar2 = (b->u).direct.len;
    uVar4 = uVar2 - ofs;
    if (uVar2 < ofs || uVar4 == 0) {
      *len = 0;
      return 1;
    }
    uVar2 = *len;
    if (uVar4 < *len) {
      *len = uVar4;
      plVar3 = (b->u).bl;
      uVar2 = uVar4;
    }
    memcpy(buf,(void *)((long)&plVar3->next + ofs),uVar2);
  }
  return 0;
}

Assistant:

int
lws_system_blob_get(lws_system_blob_t *b, uint8_t *buf, size_t *len, size_t ofs)
{
	int n;

	if (b->is_direct) {

		assert(b->u.direct.ptr);

		if (ofs >= b->u.direct.len) {
			*len = 0;
			return 1;
		}

		if (*len > b->u.direct.len - ofs)
			*len = b->u.direct.len - ofs;

		memcpy(buf, b->u.direct.ptr + ofs, *len);

		return 0;
	}

	n = lws_buflist_linear_copy(&b->u.bl, ofs, buf, *len);
	if (n < 0)
		return -2;

	*len = n;

	return 0;
}